

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

Variable __thiscall LiteScript::Array::ConstantGet(Array *this,char *name)

{
  int iVar1;
  uint *extraout_RDX;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  Variable VVar6;
  uint *puVar2;
  
  uVar3 = (*(long *)(name + 8) - *(long *)name >> 4) * -0x5555555555555555;
  bVar5 = (uVar3 & 0xffffffff) != 0;
  if (bVar5) {
    iVar1 = std::__cxx11::string::compare(*(char **)name);
    if (iVar1 == 0) {
      uVar4 = 0;
    }
    else {
      uVar3 = uVar3 & 0xffffffff;
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
        if (uVar4 == uVar3) goto LAB_0013e2fe;
        iVar1 = std::__cxx11::string::compare((char *)(uVar4 * 0x30 + *(long *)name));
      } while (iVar1 != 0);
      bVar5 = uVar4 < uVar3;
    }
    Variable::Variable((Variable *)this,(Variable *)(*(long *)name + uVar4 * 0x30 + 0x20));
    puVar2 = extraout_RDX;
    if (bVar5) goto LAB_0013e314;
  }
LAB_0013e2fe:
  VVar6 = Memory::Create((Memory *)this,*(Type **)(name + 0x30));
  puVar2 = VVar6.nb_ref;
LAB_0013e314:
  VVar6.nb_ref = puVar2;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::Array::ConstantGet(const char * name) const {
    for (unsigned int i = 0, sz = this->named.size(); i < sz; i++) {
        if (this->named[i].first == name)
            return Variable(this->named[i].second);
    }
    return this->memory.Create(Type::UNDEFINED);
}